

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

string * fs_get_shell_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  string_view local_60;
  string_view local_50 [2];
  allocator<char> local_29;
  passwd *local_28;
  passwd *pw;
  error_code ec;
  
  std::error_code::error_code((error_code *)&pw);
  local_28 = fs_getpwuid();
  if (local_28 == (passwd *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_50,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"fs_get_shell");
    fs_print_error(local_50[0],local_60,(error_code *)&pw);
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    __s = local_28->pw_shell;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return in_RDI;
}

Assistant:

std::string
fs_get_shell()
{

  std::error_code ec;

#if defined(_WIN32)
  const HANDLE h = CreateToolhelp32Snapshot(TH32CS_SNAPPROCESS, 0);
  // 0: current process
  PROCESSENTRY32 pe;
  ZeroMemory(&pe, sizeof(PROCESSENTRY32));
  pe.dwSize = sizeof(PROCESSENTRY32);
  HMODULE hMod;
  DWORD cbNeeded;

  std::string name(fs_get_max_path(), '\0');

  if( Process32First(h, &pe)) {
    const DWORD pid = GetCurrentProcessId();
    do {
      if (pe.th32ProcessID == pid) {
        HANDLE hProcess = OpenProcess( PROCESS_QUERY_INFORMATION | PROCESS_VM_READ, FALSE, pe.th32ParentProcessID);

        if ( EnumProcessModules( hProcess, &hMod, sizeof(hMod), &cbNeeded) ) {
          if(DWORD L = GetModuleBaseNameA( hProcess, hMod, name.data(), static_cast<DWORD>(name.size()) );
              !CloseHandle(hProcess) || L == 0)
            ec = std::make_error_code(std::errc::io_error);
          else
            name.resize(L);

          break;
        }
if(fs_trace) std::cout << "TRACE: get_shell: " << name << " PID: " << pid << " PPID: " << pe.th32ParentProcessID << "\n";
      }
    } while( Process32Next(h, &pe));
  }

  if (CloseHandle(h) && !ec)
    return name;
#else
  if (auto pw = fs_getpwuid())
    return pw->pw_shell;
#endif

  fs_print_error("", __func__, ec);
  return {};
}